

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int is_pattern_silent(IT_PATTERN *pattern,int order)

{
  byte bVar1;
  int iVar2;
  IT_ENTRY *pIVar3;
  int iVar4;
  int iVar5;
  IT_ENTRY *pIVar6;
  uint uVar7;
  
  if (pattern == (IT_PATTERN *)0x0) {
    return 2;
  }
  if (pattern->n_rows == 0) {
    return 2;
  }
  iVar2 = pattern->n_entries;
  if ((long)iVar2 == 0) {
    return 2;
  }
  pIVar3 = pattern->entry;
  if (pIVar3 == (IT_ENTRY *)0x0) {
    return 2;
  }
  if (iVar2 == pattern->n_rows) {
    iVar4 = 0;
    pIVar6 = pIVar3;
    iVar5 = iVar4;
    if (0 < iVar2) {
      do {
        iVar5 = iVar4;
        if (pIVar6->channel < 0x40) break;
        iVar4 = iVar4 + 1;
        pIVar6 = pIVar6 + 1;
        iVar5 = iVar2;
      } while (iVar2 != iVar4);
    }
    if (iVar5 == iVar2) {
      return 2;
    }
  }
  if (iVar2 < 1) {
    iVar2 = 1;
  }
  else {
    pIVar6 = pIVar3 + iVar2;
    iVar5 = 1;
    do {
      if (pIVar3->channel < 0x40) {
        bVar1 = pIVar3->mask;
        iVar2 = 0;
        if ((bVar1 & 6) != 0) {
          return 0;
        }
        if (((bVar1 & 1) != 0) && (pIVar3->note < 0x78)) {
          return 0;
        }
        if ((bVar1 & 8) != 0) {
          bVar1 = pIVar3->effect;
          if (bVar1 < 0xc) {
            if (bVar1 == 1) {
              iVar5 = (iVar5 + 1) - (uint)(pIVar3->effectvalue < 0x41);
            }
            else {
              if (bVar1 == 2) {
                uVar7 = (uint)pIVar3->effectvalue;
              }
              else {
                if (bVar1 != 3) {
                  return 0;
                }
                uVar7 = (pIVar3->effectvalue & 0xf) + (uint)(pIVar3->effectvalue >> 4) * 10;
              }
              if (uVar7 != order) {
                return 0;
              }
            }
          }
          else {
            switch(bVar1) {
            case 0xc:
            case 0xf:
            case 0x16:
            case 0x17:
              bVar1 = pIVar3->effectvalue;
joined_r0x006eccfd:
              if (bVar1 != 0) {
                return 0;
              }
              break;
            case 0xd:
            case 0xe:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x15:
              goto switchD_006ecc68_caseD_d;
            case 0x13:
              bVar1 = pIVar3->effectvalue;
              switch(bVar1 >> 4) {
              case 6:
              case 0xb:
              case 0xe:
                iVar5 = iVar5 + 1;
                break;
              case 7:
                if (2 < (bVar1 & 0xf)) {
                  return 0;
                }
                break;
              case 8:
              case 9:
              case 10:
              case 0xc:
              case 0xd:
                goto switchD_006ecc68_caseD_d;
              default:
                if (bVar1 >> 4 == 0) goto joined_r0x006eccfd;
                goto switchD_006ecc68_caseD_d;
              }
              break;
            case 0x14:
              break;
            default:
              if (bVar1 != 0x20) {
                return 0;
              }
            }
          }
        }
      }
      pIVar3 = pIVar3 + 1;
      iVar2 = iVar5;
    } while (pIVar3 < pIVar6);
  }
switchD_006ecc68_caseD_d:
  return iVar2;
}

Assistant:

static int is_pattern_silent(IT_PATTERN * pattern, int order) {
	int ret = 1;
	IT_ENTRY * entry, * end;
	if (!pattern || !pattern->n_rows || !pattern->n_entries || !pattern->entry) return 2;

	if ( pattern->n_entries == pattern->n_rows ) {
		int n;
		entry = pattern->entry;
		for ( n = 0; n < pattern->n_entries; ++n, ++entry ) {
			if ( !IT_IS_END_ROW(entry) ) break;
		}
		if ( n == pattern->n_entries ) return 2;
		// broken?
	}

	entry = pattern->entry;
	end = entry + pattern->n_entries;

	while (entry < end) {
		if (!IT_IS_END_ROW(entry)) {
			if (entry->mask & (IT_ENTRY_INSTRUMENT | IT_ENTRY_VOLPAN))
				return 0;
			if (entry->mask & IT_ENTRY_NOTE && entry->note < 120)
				return 0;
			if (entry->mask & IT_ENTRY_EFFECT) {
				switch (entry->effect) {
					case IT_SET_GLOBAL_VOLUME:
						if (entry->effectvalue) return 0;
						break;

					case IT_SET_SPEED:
						if (entry->effectvalue > 64) ret++;
						break;

					case IT_SET_SONG_TEMPO:
					case IT_XM_KEY_OFF:
						break;

					case IT_JUMP_TO_ORDER:
						if (entry->effectvalue != order)
							return 0;
						break;

					case IT_S:
						switch (entry->effectvalue >> 4) {
							case 0: // meh bastard
								if ( entry->effectvalue != 0 ) return 0;
								break;

							case IT_S_FINE_PATTERN_DELAY:
							case IT_S_PATTERN_LOOP:
							case IT_S_PATTERN_DELAY:
								ret++;
								break;

							case IT_S7:
								if ((entry->effectvalue & 15) > 2)
									return 0;
								break;

							default:
								return 0;
						}
						break;

					// clever idiot with his S L O W crap; do nothing
					case IT_VOLSLIDE_TONEPORTA:
					case IT_SET_SAMPLE_OFFSET:
					case IT_GLOBAL_VOLUME_SLIDE:
						if ( entry->effectvalue != 0 ) return 0;
						break;

					// genius also uses this instead of jump to order by mistake, meh, and it's bloody BCD
					case IT_BREAK_TO_ROW:						
						if ( ( ( entry->effectvalue >> 4 ) * 10 + ( entry->effectvalue & 15 ) ) != order ) return 0;
						break;

					default:
						return 0;
				}
			}
		}
		entry++;
	}

	return ret;
}